

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.cpp
# Opt level: O1

int lua_getinfo(lua_State *L,char *what,lua_Debug *ar)

{
  byte bVar1;
  void *pvVar2;
  GCObject *pGVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  TValue *i_o;
  char *pcVar7;
  GCObject *pGVar8;
  TValue *pTVar9;
  StkId pTVar10;
  byte *pbVar11;
  CallInfo *ci;
  long lVar12;
  GCObject *pGVar13;
  int iVar14;
  
  if (*what == '>') {
    pTVar10 = L->top;
    if (pTVar10[-1].tt != 6) {
      __assert_fail("(((func)->tt) == 6)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cuberite[P]lua/src/ldebug.cpp"
                    ,0xef,"int lua_getinfo(lua_State *, const char *, lua_Debug *)");
    }
    what = what + 1;
    pGVar13 = pTVar10[-1].value.gc;
    L->top = pTVar10 + -1;
    ci = (CallInfo *)0x0;
  }
  else if ((long)ar->i_ci == 0) {
    ci = (CallInfo *)0x0;
    pGVar13 = (GCObject *)0x0;
  }
  else {
    ci = L->base_ci + ar->i_ci;
    pGVar13 = (ci->func->value).gc;
  }
  if (pGVar13 == (GCObject *)0x0) {
    ar->namewhat = "";
    ar->name = "";
    ar->what = "tail";
    ar->currentline = -1;
    ar->linedefined = -1;
    ar->lastlinedefined = -1;
    ar->source = "=(tail call)";
    luaO_chunkid(ar->short_src,"=(tail call)",0x3c);
    ar->nups = 0;
    iVar14 = 1;
LAB_0010985f:
    pcVar7 = strchr(what,0x66);
    if (pcVar7 != (char *)0x0) {
      pTVar10 = L->top;
      if (pGVar13 == (GCObject *)0x0) {
        iVar5 = 0;
      }
      else {
        (pTVar10->value).gc = pGVar13;
        iVar5 = 6;
      }
      pTVar10->tt = iVar5;
      if ((long)L->stack_last - (long)L->top < 0x11) {
        luaD_growstack(L,1);
      }
      L->top = L->top + 1;
    }
    pcVar7 = strchr(what,0x4c);
    if (pcVar7 != (char *)0x0) {
      if ((pGVar13 == (GCObject *)0x0) || ((pGVar13->h).flags != '\0')) {
        pTVar10 = L->top;
        iVar5 = 0;
      }
      else {
        pGVar8 = (GCObject *)luaH_new(L,0,0);
        if (0 < *(int *)((long)&((pGVar13->th).l_G)->tmudata + 4)) {
          pGVar3 = ((pGVar13->th).l_G)->rootgc;
          lVar12 = 0;
          do {
            pTVar9 = luaH_setnum(L,&pGVar8->h,*(int *)((long)pGVar3 + lVar12 * 4));
            (pTVar9->value).b = 1;
            pTVar9->tt = 1;
            lVar12 = lVar12 + 1;
          } while (lVar12 < *(int *)((long)&((pGVar13->th).l_G)->tmudata + 4));
        }
        pTVar10 = L->top;
        (pTVar10->value).gc = pGVar8;
        iVar5 = 5;
      }
      pTVar10->tt = iVar5;
      if ((long)L->stack_last - (long)L->top < 0x11) {
        luaD_growstack(L,1);
      }
      L->top = L->top + 1;
    }
    return iVar14;
  }
  iVar14 = 1;
  pbVar11 = (byte *)what;
  do {
    bVar1 = *pbVar11;
    if (bVar1 < 0x6c) {
      if (bVar1 < 0x53) {
        if (bVar1 != 0x4c) {
          if (bVar1 == 0) goto LAB_0010985f;
LAB_00109663:
          iVar14 = 0;
        }
      }
      else if (bVar1 == 0x53) {
        if ((pGVar13->h).flags == '\0') {
          ar->source = (char *)&(((pGVar13->th).l_G)->grayagain->h).array;
          iVar5 = (int)(((pGVar13->th).l_G)->buff).n;
          ar->linedefined = iVar5;
          ar->lastlinedefined = *(int *)((long)&(((pGVar13->th).l_G)->buff).n + 4);
          pcVar7 = "Lua";
          if (iVar5 == 0) {
            pcVar7 = "main";
          }
        }
        else {
          ar->source = "=[C]";
          ar->linedefined = -1;
          ar->lastlinedefined = -1;
          pcVar7 = "C";
        }
        ar->what = pcVar7;
        luaO_chunkid(ar->short_src,ar->source,0x3c);
      }
      else if (bVar1 != 0x66) goto LAB_00109663;
    }
    else if (bVar1 == 0x6c) {
      iVar5 = -1;
      if ((ci != (CallInfo *)0x0) && (uVar4 = currentpc(L,ci), -1 < (int)uVar4)) {
        pGVar8 = ((((ci->func->value).gc)->th).l_G)->rootgc;
        if (pGVar8 == (GCObject *)0x0) {
          iVar5 = 0;
        }
        else {
          iVar5 = *(int *)((long)pGVar8 + (ulong)uVar4 * 4);
        }
      }
      ar->currentline = iVar5;
    }
    else if (bVar1 == 0x6e) {
      if ((ci == (CallInfo *)0x0) ||
         ((((ci->func->tt == 6 && ((((ci->func->value).gc)->h).flags == '\0')) &&
           (0 < ci->tailcalls)) ||
          (((ci[-1].func)->tt != 6 ||
           (pGVar8 = ((ci[-1].func)->value).gc, (pGVar8->h).flags != '\0')))))) {
LAB_001097db:
        pcVar7 = (char *)0x0;
      }
      else {
        pvVar2 = ((pGVar8->th).l_G)->ud;
        iVar5 = currentpc(L,ci + -1);
        uVar4 = *(uint *)((long)pvVar2 + (long)iVar5 * 4);
        uVar6 = uVar4 & 0x3f;
        if (0x21 < uVar6) goto LAB_001097db;
        pcVar7 = (char *)0x0;
        if ((0x230000000U >> uVar6 & 1) != 0) {
          pcVar7 = getobjname(L,ci + -1,uVar4 >> 6 & 0xff,&ar->name);
        }
      }
      ar->namewhat = pcVar7;
      if (pcVar7 == (char *)0x0) {
        ar->namewhat = "";
        ar->name = (char *)0x0;
      }
    }
    else {
      if (bVar1 != 0x75) goto LAB_00109663;
      ar->nups = (uint)(pGVar13->h).lsizenode;
    }
    pbVar11 = pbVar11 + 1;
  } while( true );
}

Assistant:

LUA_API int lua_getinfo (lua_State *L, const char *what, lua_Debug *ar) {
  int status;
  Closure *f = NULL;
  CallInfo *ci = NULL;
  lua_lock(L);
  if (*what == '>') {
    StkId func = L->top - 1;
    luai_apicheck(L, ttisfunction(func));
    what++;  /* skip the '>' */
    f = clvalue(func);
    L->top--;  /* pop function */
  }
  else if (ar->i_ci != 0) {  /* no tail call? */
    ci = L->base_ci + ar->i_ci;
    lua_assert(ttisfunction(ci->func));
    f = clvalue(ci->func);
  }
  status = auxgetinfo(L, what, ar, f, ci);
  if (strchr(what, 'f')) {
    if (f == NULL) setnilvalue(L->top);
    else setclvalue(L, L->top, f);
    incr_top(L);
  }
  if (strchr(what, 'L'))
    collectvalidlines(L, f);
  lua_unlock(L);
  return status;
}